

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O0

Matrix * Transp_M(Matrix *M)

{
  LASErrIdType LVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *MResName;
  Matrix *MRes;
  Matrix *M_local;
  
  M_Lock(M);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    MResName = (char *)malloc(0x50);
    pcVar2 = M_GetName(M);
    sVar3 = strlen(pcVar2);
    pcVar2 = (char *)malloc(sVar3 + 10);
    if (((Matrix *)MResName == (Matrix *)0x0) || (pcVar2 == (char *)0x0)) {
      pcVar4 = M_GetName(M);
      LASError(LASMemAllocErr,"Transp_M",pcVar4,(char *)0x0,(char *)0x0);
      if ((Matrix *)MResName != (Matrix *)0x0) {
        free(MResName);
      }
    }
    else {
      pcVar4 = M_GetName(M);
      sprintf(pcVar2,"(%s)^T",pcVar4);
      M_Constr((Matrix *)MResName,pcVar2,M->ClmDim,M->RowDim,M->ElOrder,Tempor,False);
      LVar1 = LASResult();
      if (LVar1 == LASOK) {
        if (M->ElOrder == Rowws) {
          ((Matrix *)MResName)->ElOrder = Clmws;
        }
        if (M->ElOrder == Clmws) {
          ((Matrix *)MResName)->ElOrder = Rowws;
        }
        ((Matrix *)MResName)->Multipl = M->Multipl;
        if ((M->Instance == Tempor) && (M->OwnData != False)) {
          M->OwnData = False;
          ((Matrix *)MResName)->OwnData = True;
        }
        ((Matrix *)MResName)->Len = M->Len;
        ((Matrix *)MResName)->El = M->El;
        ((Matrix *)MResName)->ElSorted = M->ElSorted;
      }
    }
    if (pcVar2 != (char *)0x0) {
      free(pcVar2);
    }
  }
  else {
    MResName = (char *)0x0;
  }
  M_Unlock(M);
  return (Matrix *)MResName;
}

Assistant:

Matrix *Transp_M(Matrix *M)
/* MRes = M^T, returns transposed matrix M */
{
    Matrix *MRes;

    char *MResName;

    M_Lock(M);
    
    if (LASResult() == LASOK) {
        MRes = (Matrix *)malloc(sizeof(Matrix));
        MResName = (char *)malloc((strlen(M_GetName(M)) + 10) * sizeof(char));
        if (MRes != NULL && MResName != NULL) {
            sprintf(MResName, "(%s)^T", M_GetName(M));
            M_Constr(MRes, MResName,  M->ClmDim, M->RowDim, M->ElOrder, Tempor, False);
            if (LASResult() == LASOK) {
                if (M->ElOrder == Rowws)
                    MRes->ElOrder = Clmws;
                if (M->ElOrder == Clmws)
                    MRes->ElOrder = Rowws;
                MRes->Multipl = M->Multipl;
                if (M->Instance == Tempor && M->OwnData) {
                    M->OwnData = False;
                    MRes->OwnData = True;
                }
                MRes->Len = M->Len;
                MRes->El = M->El;
                MRes->ElSorted = M->ElSorted;
            }
        } else {
            LASError(LASMemAllocErr, "Transp_M", M_GetName(M), NULL, NULL);
            if (MRes != NULL)
                free(MRes);
        }
            
        if (MResName != NULL)
            free(MResName);
    } else {
        MRes = NULL;
    }

    M_Unlock(M);

    return(MRes);
}